

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-caster.h
# Opt level: O0

int dynamicgraph::signal_io_base<int>::cast(istringstream *is)

{
  ulong uVar1;
  ExceptionSignal *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  ErrorCodeEnum local_18;
  int local_14;
  istringstream *piStack_10;
  int inst;
  istringstream *is_local;
  
  piStack_10 = is;
  std::istream::operator>>((istream *)is,&local_14);
  uVar1 = std::ios::fail();
  if ((uVar1 & 1) == 0) {
    return local_14;
  }
  this = (ExceptionSignal *)__cxa_allocate_exception(0x30);
  local_18 = GENERIC;
  std::__cxx11::istringstream::str();
  std::operator+(&local_38,"failed to serialize ",&local_58);
  dynamicgraph::ExceptionSignal::ExceptionSignal(this,&local_18,(string *)&local_38);
  __cxa_throw(this,&ExceptionSignal::typeinfo,ExceptionSignal::~ExceptionSignal);
}

Assistant:

inline static T cast(std::istringstream &is) {
    T inst;
    is >> inst;
    if (is.fail()) {
      throw ExceptionSignal(ExceptionSignal::GENERIC,
                            "failed to serialize " + is.str());
    }
    return inst;
  }